

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::BufferMapUnsyncWriteCase::iterate(BufferMapUnsyncWriteCase *this)

{
  CallLogWrapper *this_00;
  deUint32 seed;
  deUint32 buffer;
  int iVar1;
  GLenum GVar2;
  int iVar3;
  void *__dest;
  TestError *this_01;
  char *description;
  size_t in_R9;
  byte bVar4;
  ReferenceBuffer refBuf;
  VertexArrayVerifier verifier;
  
  deqp::gls::BufferTestUtil::VertexArrayVerifier::VertexArrayVerifier
            (&verifier,(this->super_BufferCase).m_renderCtx,
             ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  seed = deStringHash((this->super_BufferCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p
                     );
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize(&refBuf,0x4b0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes
            (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,0x4b0,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  this_00 = &(this->super_BufferCase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  glu::CallLogWrapper::glBufferData
            (this_00,this->m_bufferTarget,0x4b0,
             refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start,this->m_usage);
  iVar1 = deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
                    (&verifier,(EVP_PKEY_CTX *)(ulong)buffer,
                     refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                     ._M_impl.super__Vector_impl_data._M_start,0,(uchar *)0x4b0,in_R9);
  glu::CallLogWrapper::glBindBuffer(this_00,this->m_bufferTarget,buffer);
  __dest = glu::CallLogWrapper::glMapBufferRange(this_00,this->m_bufferTarget,0,0x4b0,0x22);
  GVar2 = glu::CallLogWrapper::glGetError(this_00);
  glu::checkError(GVar2,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x1bc);
  if (__dest != (void *)0x0) {
    deqp::gls::BufferTestUtil::fillWithRandomBytes
              (refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,0x4b0,seed & 0xabcdef);
    memcpy(__dest,refBuf.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start,0x4b0);
    glu::CallLogWrapper::glUnmapBuffer(this_00,this->m_bufferTarget);
    GVar2 = glu::CallLogWrapper::glGetError(this_00);
    glu::checkError(GVar2,"glUnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                    ,0x1c3);
    glu::CallLogWrapper::glFinish(this_00);
    iVar3 = deqp::gls::BufferTestUtil::VertexArrayVerifier::verify
                      (&verifier,(EVP_PKEY_CTX *)(ulong)buffer,
                       refBuf.m_data.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,0,(uchar *)0x4b0,in_R9);
    deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
    bVar4 = (byte)iVar1 & (byte)iVar3;
    description = "Buffer verification failed";
    if (bVar4 != 0) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar4 ^ 1),
               description);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&refBuf);
    deqp::gls::BufferTestUtil::VertexArrayVerifier::~VertexArrayVerifier(&verifier);
    return STOP;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x1bd);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		VertexArrayVerifier	verifier	(m_renderCtx, m_testCtx.getLog());
		deUint32			dataSeed	= deStringHash(getName());
		ReferenceBuffer		refBuf;
		deUint32			buf			= 0;
		bool				isOk		= true;
		const int			size		= 1200;

		// Setup reference data.
		refBuf.setSize(size);
		fillWithRandomBytes(refBuf.getPtr(), size, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, size, refBuf.getPtr(), m_usage);

		// Use for rendering.
		if (!verifier.verify(buf, refBuf.getPtr(), 0, size))
			isOk = false;
		// \note ReadPixels() implies Finish

		glBindBuffer(m_bufferTarget, buf);
		void* ptr = glMapBufferRange(m_bufferTarget, 0, size, GL_MAP_WRITE_BIT|GL_MAP_UNSYNCHRONIZED_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		fillWithRandomBytes(refBuf.getPtr(), size, dataSeed&0xabcdef);
		deMemcpy(ptr, refBuf.getPtr(), size);

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		// Synchronize.
		glFinish();

		if (!verifier.verify(buf, refBuf.getPtr(), 0, size))
			isOk = false;

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}